

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

void extendFortressPiece(PieceEnv *env,Piece *p)

{
  int offv;
  ulong uVar1;
  int offh;
  int turn;
  uint corridor;
  
  switch(p->type) {
  case '\0':
  case '\x02':
    extendFortress(env,p,8,3,0,0);
    extendFortress(env,p,8,3,-1,0);
    offh = 8;
    offv = 3;
    break;
  case '\x01':
    offh = 1;
    offv = 3;
    turn = 0;
    goto LAB_0011054b;
  case '\x03':
    extendFortress(env,p,2,0,0,0);
    extendFortress(env,p,2,0,-1,0);
    offh = 2;
    offv = 0;
    break;
  case '\x04':
    offh = 2;
    offv = 6;
    break;
  default:
    return;
  case '\x06':
    offh = 5;
    offv = 3;
    goto LAB_0011045c;
  case '\a':
  case '\v':
    offh = 1;
    offv = 0;
    goto LAB_0011045c;
  case '\b':
    extendFortress(env,p,1,0,0,1);
    extendFortress(env,p,1,0,-1,1);
  case '\t':
    offh = 1;
    offv = 0;
    turn = 1;
    goto LAB_001105c0;
  case '\n':
    offh = 1;
    offv = 0;
    turn = -1;
    goto LAB_001105c0;
  case '\f':
    offh = 5;
    if (p->rot != '\0') {
      offh = (uint)(p->rot == '\x03') * 4 + 1;
    }
    uVar1 = *env->rng * 0x5deece66d + 0xb;
    *env->rng = uVar1 & 0xffffffffffff;
    extendFortress(env,p,offh,0,-1,(uint)((uVar1 & 0xe00000000000) != 0));
    uVar1 = *env->rng * 0x5deece66d + 0xb;
    *env->rng = uVar1 & 0xffffffffffff;
    corridor = (uint)((uVar1 & 0xe00000000000) != 0);
    offv = 0;
    turn = 1;
    goto LAB_001105c6;
  case '\r':
    extendFortress(env,p,5,3,0,1);
    offh = 5;
    offv = 0xb;
LAB_0011045c:
    turn = 0;
LAB_001105c0:
    corridor = 1;
    goto LAB_001105c6;
  }
  turn = 1;
LAB_0011054b:
  corridor = 0;
LAB_001105c6:
  extendFortress(env,p,offh,offv,turn,corridor);
  return;
}

Assistant:

static
void extendFortressPiece(PieceEnv *env, Piece *p)
{
    if (p->type == BRIDGE_STRAIGHT) {
        extendFortress(env, p, 1, 3,  0, 0);
    } else if (p->type == BRIDGE_CROSSING || p->type == FORTRESS_START) {
        extendFortress(env, p, 8, 3,  0, 0);
        extendFortress(env, p, 8, 3, -1, 0);
        extendFortress(env, p, 8, 3,  1, 0);
    } else if (p->type == BRIDGE_FORTIFIED_CROSSING) {
        extendFortress(env, p, 2, 0,  0, 0);
        extendFortress(env, p, 2, 0, -1, 0);
        extendFortress(env, p, 2, 0,  1, 0);
    } else if (p->type == BRIDGE_STAIRS) {
        extendFortress(env, p, 2, 6,  1, 0);
    } else if (p->type == BRIDGE_CORRIDOR_ENTRANCE) {
        extendFortress(env, p, 5, 3,  0, 1);
    } else if (p->type == CORRIDOR_STRAIGHT) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_CROSSING) {
        extendFortress(env, p, 1, 0,  0, 1);
        extendFortress(env, p, 1, 0, -1, 1);
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_RIGHT) {
        extendFortress(env, p, 1, 0,  1, 1);
    } else if (p->type == CORRIDOR_TURN_LEFT) {
        extendFortress(env, p, 1, 0, -1, 1);
    } else if (p->type == CORRIDOR_STAIRS) {
        extendFortress(env, p, 1, 0,  0, 1);
    } else if (p->type == CORRIDOR_T_CROSSING) {
        int h = (p->rot == 0 || p->rot == 3) ? 5 : 1;
        extendFortress(env, p, h, 0, -1, nextInt(env->rng, 8) != 0);
        extendFortress(env, p, h, 0,  1, nextInt(env->rng, 8) != 0);
    } else if (p->type == CORRIDOR_NETHER_WART) {
        extendFortress(env, p, 5, 3,  0, 1);
        extendFortress(env, p, 5, 11, 0, 1);
    }
}